

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_zTXt(ucvector *out,char *keyword,char *textstring,
                  LodePNGCompressSettings *zlibsettings)

{
  long lVar1;
  ucvector *puVar2;
  uchar *in;
  LodePNGCompressSettings *settings;
  uint in_EAX;
  uint uVar3;
  uint extraout_EAX;
  uchar *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uchar *data;
  ulong uVar8;
  uchar uVar9;
  size_t sVar10;
  ucvector compressed;
  ulong local_80;
  uchar *local_78;
  size_t asStack_70 [3];
  size_t local_58;
  ucvector *local_50;
  uchar *local_48;
  LodePNGCompressSettings *local_40;
  char *local_38;
  
  local_58 = 0xffffffffffffffff;
  do {
    lVar1 = local_58 + 1;
    local_58 = local_58 + 1;
  } while (textstring[lVar1] != '\0');
  local_78 = (uchar *)0x0;
  asStack_70[0] = 0;
  asStack_70[1] = 0;
  uVar9 = *keyword;
  if (uVar9 == '\0') {
    return in_EAX;
  }
  uVar8 = 0xffffffffffffffff;
  uVar5 = 0;
  local_80 = 0;
  data = (uchar *)0x0;
  local_50 = out;
  local_48 = (uchar *)textstring;
  local_40 = zlibsettings;
  local_38 = keyword;
  do {
    uVar7 = local_80 + 1;
    puVar4 = data;
    uVar6 = uVar5;
    if (uVar5 < uVar7) {
      uVar6 = uVar7 * 3 >> 1;
      if (uVar5 * 2 < uVar7) {
        uVar6 = uVar7;
      }
      puVar4 = (uchar *)realloc(data,uVar6);
      keyword = local_38;
      if (puVar4 != (uchar *)0x0) goto LAB_0011712e;
    }
    else {
LAB_0011712e:
      uVar5 = uVar6;
      puVar4[local_80] = uVar9;
      local_80 = uVar7;
      data = puVar4;
    }
    settings = local_40;
    in = local_48;
    uVar9 = keyword[uVar8 + 2];
    uVar8 = uVar8 + 1;
  } while (uVar9 != '\0');
  if (0x4e < uVar8) {
    return (uint)puVar4;
  }
  uVar8 = local_80 + 1;
  puVar4 = data;
  uVar7 = uVar5;
  if (uVar5 < uVar8) {
    uVar7 = uVar8 * 3 >> 1;
    if (uVar5 * 2 < uVar8) {
      uVar7 = uVar8;
    }
    puVar4 = (uchar *)realloc(data,uVar7);
    uVar6 = uVar8;
    if (puVar4 != (uchar *)0x0) goto LAB_001171b1;
  }
  else {
LAB_001171b1:
    uVar5 = uVar7;
    puVar4[local_80] = '\0';
    data = puVar4;
    uVar6 = local_80 + 2;
    local_80 = uVar8;
  }
  puVar4 = data;
  uVar8 = uVar5;
  if (uVar5 < uVar6) {
    uVar8 = uVar6 * 3 >> 1;
    if (uVar5 * 2 < uVar6) {
      uVar8 = uVar6;
    }
    puVar4 = (uchar *)realloc(data,uVar8);
    if (puVar4 == (uchar *)0x0) goto LAB_0011720b;
  }
  uVar5 = uVar8;
  puVar4[uVar6 - 1] = '\0';
  local_80 = uVar6;
  data = puVar4;
LAB_0011720b:
  if (settings->custom_zlib ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    uVar3 = lodepng_zlib_compress(&local_78,asStack_70,in,local_58,settings);
  }
  else {
    uVar3 = (*settings->custom_zlib)(&local_78,asStack_70,in,local_58,settings);
  }
  if (uVar3 == 0) {
    if (asStack_70[0] != 0) {
      sVar10 = 0;
      do {
        uVar9 = local_78[sVar10];
        uVar8 = local_80 + 1;
        puVar4 = data;
        uVar7 = uVar5;
        if (uVar5 < uVar8) {
          uVar7 = uVar8 * 3 >> 1;
          if (uVar5 * 2 < uVar8) {
            uVar7 = uVar8;
          }
          puVar4 = (uchar *)realloc(data,uVar7);
          if (puVar4 != (uchar *)0x0) goto LAB_001172ac;
        }
        else {
LAB_001172ac:
          uVar5 = uVar7;
          puVar4[local_80] = uVar9;
          data = puVar4;
          local_80 = uVar8;
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != asStack_70[0]);
    }
    puVar2 = local_50;
    uVar3 = lodepng_chunk_create(&local_50->data,&local_50->size,(uint)local_80,"zTXt",data);
    if (uVar3 == 0) {
      puVar2->allocsize = puVar2->size;
    }
  }
  asStack_70[0] = 0;
  asStack_70[1] = 0;
  free(local_78);
  local_78 = (uchar *)0x0;
  free(data);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_zTXt(ucvector* out, const char* keyword, const char* textstring,
                              LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  ucvector data, compressed;
  size_t i, textsize = lodepng_strlen(textstring);

  ucvector_init(&data);
  ucvector_init(&compressed);
  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&data, 0); /*0 termination char*/
  ucvector_push_back(&data, 0); /*compression method: 0*/

  error = zlib_compress(&compressed.data, &compressed.size,
                        (const unsigned char*)textstring, textsize, zlibsettings);
  if(!error) {
    for(i = 0; i != compressed.size; ++i) ucvector_push_back(&data, compressed.data[i]);
    error = addChunk(out, "zTXt", data.data, data.size);
  }

  ucvector_cleanup(&compressed);
  ucvector_cleanup(&data);
  return error;
}